

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidget::render(QWidget *this,QPainter *painter,QPoint *targetOffset,QRegion *sourceRegion,
               RenderFlags renderFlags)

{
  undefined1 *puVar1;
  long *plVar2;
  long *plVar3;
  QWidgetPrivate *this_00;
  QWExtra *pQVar4;
  QPaintEnginePrivate *this_01;
  long lVar5;
  QWidgetPrivate *pQVar6;
  char cVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  QPaintDevice *target;
  long lVar13;
  QPaintEnginePrivate *pQVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  QPaintEnginePrivate *pQVar17;
  byte bVar18;
  long in_FS_OFFSET;
  ulong uVar19;
  double dVar20;
  QRegion painterClip;
  QRegion oldSystemViewport;
  QRegion oldBaseClip;
  QRegion oldSystemClip;
  QRegion toBePainted;
  QTransform oldTransform;
  undefined8 local_e8;
  QRegion local_b8;
  QRegion local_b0;
  QRegion local_a8;
  QRegion local_a0;
  QRegion local_98;
  QRegion local_90;
  ushort local_40;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (painter == (QPainter *)0x0) {
    render();
    goto LAB_00302e55;
  }
  cVar7 = QPainter::isActive();
  if (cVar7 == '\0') {
    render();
    goto LAB_00302e55;
  }
  dVar20 = (double)QPainter::opacity();
  uVar19 = -(ulong)(dVar20 < -dVar20);
  if ((double)(~uVar19 & (ulong)dVar20 | (ulong)-dVar20 & uVar19) <= 1e-12) goto LAB_00302e55;
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar4 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar4 == (QWExtra *)0x0) {
    bVar18 = 0;
  }
  else {
    bVar18 = (pQVar4->field_0x7c & 0x40) >> 6;
  }
  local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  if (bVar18 == 0) {
    QWidgetPrivate::prepareToRender
              ((QWidgetPrivate *)&stack0xffffffffffffff70,(QRegion *)this_00,
               (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(sourceRegion,0));
  }
  else {
    QRegion::QRegion(&stack0xffffffffffffff70,sourceRegion);
  }
  cVar7 = QRegion::isEmpty();
  if (cVar7 == '\0') {
    if ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
      QWidgetPrivate::createExtra(this_00);
    }
    puVar1 = &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x40;
    lVar12 = QPainter::paintEngine();
    this_01 = *(QPaintEnginePrivate **)(lVar12 + 0x18);
    target = (QPaintDevice *)QPaintEngine::paintDevice();
    if (bVar18 == 0) {
      if (1.0 <= dVar20) {
        iVar10 = (**(code **)(*(long *)target + 0x10))(target);
        if (iVar10 != 4) goto LAB_00302a6d;
      }
      QWidgetPrivate::render_helper
                (this_00,painter,targetOffset,&stack0xffffffffffffff70,renderFlags);
      puVar1 = &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                 ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
      *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffbf;
    }
    else {
LAB_00302a6d:
      lVar12 = *(long *)&this_00->field_0x8;
      lVar13 = lVar12;
      do {
        plVar2 = (long *)(lVar13 + 8);
        lVar5 = *(long *)(*plVar2 + 0x10);
        if (lVar5 == 0) break;
        plVar3 = (long *)(lVar13 + 0x20);
        lVar13 = lVar5;
      } while ((*(uint *)(*plVar3 + 0xc) & 1) == 0);
      lVar13 = *(long *)(*plVar2 + 0x78);
      if (lVar13 == 0) {
        lVar13 = 0;
      }
      else {
        lVar13 = *(long *)(lVar13 + 8);
      }
      if (lVar13 == 0) {
        local_e8 = 0;
      }
      else {
        local_e8 = *(undefined8 *)(lVar13 + 0x18);
      }
      do {
        pQVar6 = *(QWidgetPrivate **)(lVar12 + 8);
        if (*(long *)&pQVar6->field_0x10 == 0) break;
        plVar2 = (long *)(lVar12 + 0x20);
        lVar12 = *(long *)&pQVar6->field_0x10;
      } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
      QWidgetPrivate::createTLExtra(pQVar6);
      *(QPainter **)
       ((long)(((pQVar6->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x18) = painter;
      puVar15 = &DAT_00672d80;
      puVar16 = (undefined8 *)&stack0xffffffffffffff78;
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar16 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar9 * -2 + 1;
        puVar16 = puVar16 + (ulong)bVar9 * -2 + 1;
      }
      pQVar14 = this_01 + 0x40;
      puVar15 = (undefined8 *)&stack0xffffffffffffff78;
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar15 = *(undefined8 *)pQVar14;
        pQVar14 = pQVar14 + (ulong)bVar9 * -0x10 + 8;
        puVar15 = puVar15 + (ulong)bVar9 * -2 + 1;
      }
      local_98.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_98,(QRegion *)(this_01 + 0x20));
      local_a0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_a0,(QRegion *)(this_01 + 0x18));
      local_a8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar14 = this_01 + 0x38;
      QRegion::QRegion(&local_a8,(QRegion *)pQVar14);
      QPainter::layoutDirection();
      cVar7 = QPainter::hasClipping();
      if (cVar7 == '\0') {
        QRegion::operator=((QRegion *)pQVar14,&local_98);
        bVar8 = QRegion::isEmpty();
        this_01[0x98] = (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfd | (bVar8 ^ 1) * '\x02');
        QPaintEnginePrivate::updateSystemClip(this_01);
        if (*(long *)(*(long *)(this_01 + 0x10) + 8) != 0) {
          (**(code **)(*(long *)this_01 + 0x10))(this_01);
        }
      }
      else {
        local_b0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QPainter::deviceTransform();
        QPainter::clipRegion();
        QTransform::map(&local_b0);
        QRegion::~QRegion(&local_b8);
        cVar7 = QRegion::isEmpty();
        if (cVar7 == '\0') {
          QRegion::operator&(&local_b8,&local_98);
        }
        else {
          QRegion::QRegion(&local_b8,&local_b0);
        }
        QRegion::operator=((QRegion *)pQVar14,&local_b8);
        bVar8 = QRegion::isEmpty();
        this_01[0x98] = (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfd | (bVar8 ^ 1) * '\x02');
        QPaintEnginePrivate::updateSystemClip(this_01);
        if (*(long *)(*(long *)(this_01 + 0x10) + 8) != 0) {
          (**(code **)(*(long *)this_01 + 0x10))(this_01);
        }
        QRegion::~QRegion(&local_b8);
        QRegion::~QRegion(&local_b0);
      }
      QPainter::setLayoutDirection((LayoutDirection)painter);
      QWidgetPrivate::render(this_00,target,targetOffset,&stack0xffffffffffffff70,renderFlags);
      QRegion::operator=((QRegion *)(this_01 + 0x18),&local_a0);
      puVar15 = (undefined8 *)&stack0xffffffffffffff78;
      pQVar17 = this_01 + 0x40;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(undefined8 *)pQVar17 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar9 * -2 + 1;
        pQVar17 = pQVar17 + (ulong)bVar9 * -0x10 + 8;
      }
      *(ushort *)(this_01 + 0x88) = local_40;
      if ((local_40 & 0x3e0) == 0) {
        uVar11 = local_40 & 0x1f;
      }
      else {
        uVar11 = QTransform::type();
      }
      this_01[0x98] = (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfe | uVar11 != 0);
      QRegion::operator=((QRegion *)pQVar14,&local_a8);
      bVar9 = QRegion::isEmpty();
      this_01[0x98] = (QPaintEnginePrivate)((byte)this_01[0x98] & 0xfd | (bVar9 ^ 1) * '\x02');
      QPaintEnginePrivate::updateSystemClip(this_01);
      if (*(long *)(*(long *)(this_01 + 0x10) + 8) != 0) {
        (**(code **)(*(long *)this_01 + 0x10))(this_01);
      }
      (**(code **)(*(long *)this_01 + 0x10))(this_01);
      QPainter::setLayoutDirection((LayoutDirection)painter);
      lVar12 = *(long *)&this_00->field_0x8;
      do {
        pQVar6 = *(QWidgetPrivate **)(lVar12 + 8);
        if (*(long *)&pQVar6->field_0x10 == 0) break;
        plVar2 = (long *)(lVar12 + 0x20);
        lVar12 = *(long *)&pQVar6->field_0x10;
      } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
      QWidgetPrivate::createTLExtra(pQVar6);
      *(undefined8 *)
       ((long)(((pQVar6->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x18) = local_e8;
      pQVar4 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      *(ushort *)&pQVar4->field_0x7c =
           (ushort)*(undefined4 *)&pQVar4->field_0x7c & 0xffbf | (ushort)bVar18 << 6;
      QRegion::~QRegion(&local_a8);
      QRegion::~QRegion(&local_a0);
      QRegion::~QRegion(&local_98);
    }
  }
  QRegion::~QRegion(&stack0xffffffffffffff70);
LAB_00302e55:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::render(QPainter *painter, const QPoint &targetOffset,
                     const QRegion &sourceRegion, RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!painter)) {
        qWarning("QWidget::render: Null pointer to painter");
        return;
    }

    if (Q_UNLIKELY(!painter->isActive())) {
        qWarning("QWidget::render: Cannot render with an inactive painter");
        return;
    }

    const qreal opacity = painter->opacity();
    if (qFuzzyIsNull(opacity))
        return; // Fully transparent.

    Q_D(QWidget);
    const bool inRenderWithPainter = d->extra && d->extra->inRenderWithPainter;
    const QRegion toBePainted = !inRenderWithPainter ? d->prepareToRender(sourceRegion, renderFlags)
                                                     : sourceRegion;
    if (toBePainted.isEmpty())
        return;

    if (!d->extra)
        d->createExtra();
    d->extra->inRenderWithPainter = true;

    QPaintEngine *engine = painter->paintEngine();
    Q_ASSERT(engine);
    QPaintEnginePrivate *enginePriv = engine->d_func();
    Q_ASSERT(enginePriv);
    QPaintDevice *target = engine->paintDevice();
    Q_ASSERT(target);

    // Render via a pixmap when dealing with non-opaque painters or printers.
    if (!inRenderWithPainter && (opacity < 1.0 || (target->devType() == QInternal::Printer))) {
        d->render_helper(painter, targetOffset, toBePainted, renderFlags);
        d->extra->inRenderWithPainter = inRenderWithPainter;
        return;
    }

    // Set new shared painter.
    QPainter *oldPainter = d->sharedPainter();
    d->setSharedPainter(painter);

    // Save current system clip, viewport and transform,
    const QTransform oldTransform = enginePriv->systemTransform;
    const QRegion oldSystemClip = enginePriv->systemClip;
    const QRegion oldBaseClip = enginePriv->baseSystemClip;
    const QRegion oldSystemViewport = enginePriv->systemViewport;
    const Qt::LayoutDirection oldLayoutDirection = painter->layoutDirection();

    // This ensures that all painting triggered by render() is clipped to the current engine clip.
    if (painter->hasClipping()) {
        const QRegion painterClip = painter->deviceTransform().map(painter->clipRegion());
        enginePriv->setSystemViewport(oldSystemClip.isEmpty() ? painterClip : oldSystemClip & painterClip);
    } else {
        enginePriv->setSystemViewport(oldSystemClip);
    }
    painter->setLayoutDirection(layoutDirection());

    d->render(target, targetOffset, toBePainted, renderFlags);

    // Restore system clip, viewport and transform.
    enginePriv->baseSystemClip = oldBaseClip;
    enginePriv->setSystemTransformAndViewport(oldTransform, oldSystemViewport);
    enginePriv->systemStateChanged();
    painter->setLayoutDirection(oldLayoutDirection);

    // Restore shared painter.
    d->setSharedPainter(oldPainter);

    d->extra->inRenderWithPainter = inRenderWithPainter;
}